

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

void ggml_fp32_to_bf16_row(float *x,ggml_bf16_t *y,int64_t n)

{
  ggml_bf16_t gVar1;
  long lVar2;
  
  lVar2 = 0;
  if (n < 1) {
    n = lVar2;
  }
  for (; n != lVar2; lVar2 = lVar2 + 1) {
    gVar1 = ggml_compute_fp32_to_bf16(x[lVar2]);
    y[lVar2].bits = gVar1.bits;
  }
  return;
}

Assistant:

void ggml_fp32_to_bf16_row(const float * x, ggml_bf16_t * y, int64_t n) {
  int i = 0;
#if defined(__AVX512BF16__)
  // subnormals are flushed to zero on this platform
  for (; i + 32 <= n; i += 32) {
        _mm512_storeu_si512(
            (__m512i *)(y + i),
            m512i(_mm512_cvtne2ps_pbh(_mm512_loadu_ps(x + i + 16),
                                _mm512_loadu_ps(x + i))));
  }
#endif
    for (; i < n; i++) {
        y[i] = GGML_FP32_TO_BF16(x[i]);
    }
}